

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  short sVar1;
  int iVar2;
  jpeg_entropy_encoder *pjVar3;
  JBLOCKROW paJVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  _func_void_j_compress_ptr *p_Var13;
  int local_5c;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar7 = *(uint *)&pjVar3[4].start_pass;
    if (uVar7 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar3[4].start_pass + 4));
      uVar7 = cinfo->restart_interval;
      *(uint *)((long)&pjVar3[4].start_pass + 4) =
           *(int *)((long)&pjVar3[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar3[4].start_pass = uVar7 - 1;
  }
  paJVar4 = *MCU_data;
  iVar2 = cinfo->cur_comp_info[0]->ac_tbl_no;
  uVar7 = cinfo->Se;
  for (uVar8 = (ulong)uVar7; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
    sVar1 = (*paJVar4)[jpeg_natural_order[uVar8]];
    uVar6 = (uint)sVar1;
    if (sVar1 < 0) {
      uVar6 = -uVar6;
    }
    if (uVar6 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_00131b26;
  }
  uVar8 = (ulong)((int)uVar7 >> 0x1f & uVar7);
LAB_00131b26:
  iVar10 = cinfo->Ss;
LAB_00131b48:
  if ((int)uVar8 < iVar10) {
    if (iVar10 <= cinfo->Se) {
      arith_encode(cinfo,(uchar *)((&pjVar3[9].finish_pass)[iVar2] + (iVar10 * 3 + -3)),1);
    }
    return 1;
  }
  p_Var13 = (&pjVar3[9].finish_pass)[iVar2];
  lVar12 = (long)(iVar10 * 3 + -3);
  arith_encode(cinfo,(uchar *)(p_Var13 + lVar12),0);
  piVar9 = jpeg_natural_order + iVar10;
  p_Var13 = p_Var13 + lVar12 + 1;
  do {
    sVar1 = (*paJVar4)[*piVar9];
    uVar7 = (uint)sVar1;
    if (sVar1 < 0) {
      bVar5 = (byte)cinfo->Al & 0x1f;
      uVar6 = -uVar7 >> bVar5;
      if (-uVar7 >> bVar5 != 0) {
        local_5c = 1;
        goto LAB_00131be7;
      }
    }
    else {
      bVar5 = (byte)cinfo->Al & 0x1f;
      uVar6 = uVar7 >> bVar5;
      if (uVar7 >> bVar5 != 0) break;
    }
    arith_encode(cinfo,(uchar *)p_Var13,0);
    iVar10 = iVar10 + 1;
    piVar9 = piVar9 + 1;
    p_Var13 = p_Var13 + 3;
  } while( true );
  local_5c = 0;
LAB_00131be7:
  uVar7 = 1;
  arith_encode(cinfo,(uchar *)p_Var13,1);
  arith_encode(cinfo,(uchar *)(pjVar3 + 0xf),local_5c);
  p_Var13 = p_Var13 + 1;
  uVar6 = uVar6 - 1;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    arith_encode(cinfo,(uchar *)p_Var13,1);
    if (uVar6 != 1) {
      arith_encode(cinfo,(uchar *)p_Var13,1);
      lVar12 = 0xbd;
      if ((int)(uint)cinfo->arith_ac_K[iVar2] < iVar10) {
        lVar12 = 0xd9;
      }
      p_Var13 = (&pjVar3[9].finish_pass)[iVar2] + lVar12;
      uVar7 = 2;
      for (uVar11 = uVar6; 3 < uVar11; uVar11 = uVar11 >> 1) {
        arith_encode(cinfo,(uchar *)p_Var13,1);
        uVar7 = uVar7 * 2;
        p_Var13 = p_Var13 + 1;
      }
    }
  }
  arith_encode(cinfo,(uchar *)p_Var13,0);
  while (1 < uVar7) {
    uVar7 = (int)uVar7 >> 1;
    arith_encode(cinfo,(uchar *)(p_Var13 + 0xe),(uint)((uVar7 & uVar6) != 0));
  }
  iVar10 = iVar10 + 1;
  goto LAB_00131b48;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, temp2;
  register int nbits, r;
  int Sl = cinfo->Se - cinfo->Ss + 1;
  int Al = cinfo->Al;
  JCOEF values_unaligned[2 * DCTSIZE2 + 15];
  JCOEF *values;
  const JCOEF *cvalue;
  size_t zerobits;
  size_t bits[8 / SIZEOF_SIZE_T];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

#ifdef WITH_SIMD
  cvalue = values = (JCOEF *)PAD((JUINTPTR)values_unaligned, 16);
#else
  /* Not using SIMD, so alignment is not needed */
  cvalue = values = values_unaligned;
#endif

  /* Prepare data */
  entropy->AC_first_prepare(MCU_data[0][0], jpeg_natural_order + cinfo->Ss,
                            Sl, Al, values, bits);

  zerobits = bits[0];
#if SIZEOF_SIZE_T == 4
  zerobits |= bits[1];
#endif

  /* Emit any pending EOBRUN */
  if (zerobits && (entropy->EOBRUN > 0))
    emit_eobrun(entropy);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[0];
#endif

  /* Encode the AC coefficients per section G.1.2.2, fig. G.3 */

  ENCODE_COEFS_AC_FIRST((void)0;);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[1];
  if (zerobits) {
    int diff = ((values + DCTSIZE2 / 2) - cvalue);
    r = count_zeroes(&zerobits);
    r += diff;
    cvalue += r;
    goto first_iter_ac_first;
  }

  ENCODE_COEFS_AC_FIRST(first_iter_ac_first:);
#endif

  if (cvalue < (values + Sl)) { /* If there are trailing zeroes, */
    entropy->EOBRUN++;          /* count an EOB */
    if (entropy->EOBRUN == 0x7FFF)
      emit_eobrun(entropy);     /* force it out to avoid overflow */
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}